

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cc
# Opt level: O2

void __thiscall fasttext::Args::dump(Args *this,ostream *out)

{
  ostream *poVar1;
  Args *pAVar2;
  string local_40;
  
  poVar1 = std::operator<<(out,"dim");
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->dim);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(out,"ws");
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->ws);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(out,"epoch");
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->epoch);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(out,"minCount");
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->minCount);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(out,"neg");
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->neg);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(out,"wordNgrams");
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->wordNgrams);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(out,"loss");
  pAVar2 = (Args *)0x123cf0;
  poVar1 = std::operator<<(poVar1," ");
  lossToString_abi_cxx11_(&local_40,pAVar2,this->loss);
  poVar1 = std::operator<<(poVar1,(string *)&local_40);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_40);
  poVar1 = std::operator<<(out,"model");
  pAVar2 = (Args *)0x123cf0;
  poVar1 = std::operator<<(poVar1," ");
  modelToString_abi_cxx11_(&local_40,pAVar2,this->model);
  poVar1 = std::operator<<(poVar1,(string *)&local_40);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::~string((string *)&local_40);
  poVar1 = std::operator<<(out,"bucket");
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->bucket);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(out,"minn");
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->minn);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(out,"maxn");
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->maxn);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(out,"lrUpdateRate");
  poVar1 = std::operator<<(poVar1," ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->lrUpdateRate);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<(out,"t");
  std::operator<<(poVar1," ");
  poVar1 = std::ostream::_M_insert<double>(this->t);
  std::endl<char,std::char_traits<char>>(poVar1);
  return;
}

Assistant:

void Args::dump(std::ostream& out) const {
  out << "dim"
      << " " << dim << std::endl;
  out << "ws"
      << " " << ws << std::endl;
  out << "epoch"
      << " " << epoch << std::endl;
  out << "minCount"
      << " " << minCount << std::endl;
  out << "neg"
      << " " << neg << std::endl;
  out << "wordNgrams"
      << " " << wordNgrams << std::endl;
  out << "loss"
      << " " << lossToString(loss) << std::endl;
  out << "model"
      << " " << modelToString(model) << std::endl;
  out << "bucket"
      << " " << bucket << std::endl;
  out << "minn"
      << " " << minn << std::endl;
  out << "maxn"
      << " " << maxn << std::endl;
  out << "lrUpdateRate"
      << " " << lrUpdateRate << std::endl;
  out << "t"
      << " " << t << std::endl;
}